

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_circular(chunk *c,loc_conflict centre,wchar_t rating)

{
  ulong uVar1;
  loc lVar2;
  wchar_t wVar3;
  uint uVar4;
  uint uVar5;
  _Bool _Var6;
  _Bool _Var7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  void *p;
  loc_conflict lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  wchar_t wVar26;
  wchar_t feat;
  wchar_t flag;
  wchar_t flag_00;
  wchar_t wVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  undefined1 in_stack_ffffffffffffff08;
  wchar_t local_c8;
  loc_conflict centre_local;
  loc_conflict offset;
  
  centre_local = centre;
  uVar8 = Rand_div(2);
  uVar9 = Rand_div(3);
  iVar23 = uVar9 + uVar8;
  wVar3 = c->depth;
  uVar10 = Rand_div(0x19);
  wVar27 = iVar23 * 2 + L'\x12';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar27,wVar27);
  local_c8 = centre.y;
  if ((c->height <= local_c8) || (c->width <= centre.x)) {
    _Var6 = find_space(&centre_local,wVar27,wVar27);
    if (!_Var6) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    local_c8 = centre_local.y;
  }
  iVar25 = uVar9 + uVar8 + 4;
  wVar26 = iVar23 + L'\x05';
  uVar13 = 0;
  wVar27 = wVar26;
  for (flag_00 = L'\0'; iVar11 = centre.x, flag_00 <= wVar26; flag_00 = flag_00 + L'\x01') {
    feat = (wchar_t)(wVar3 <= uVar10 + L'\x01');
    flag = flag_00;
    fill_xrange(c,local_c8 - flag_00,iVar11 - wVar27,wVar27 + iVar11,feat,flag_00,
                (_Bool)in_stack_ffffffffffffff08);
    fill_xrange(c,flag_00 + local_c8,iVar11 - wVar27,wVar27 + iVar11,feat,flag,
                (_Bool)in_stack_ffffffffffffff08);
    fill_yrange(c,iVar11 - flag_00,local_c8 - wVar27,local_c8 + wVar27,feat,flag,
                (_Bool)in_stack_ffffffffffffff08);
    fill_yrange(c,flag_00 + iVar11,local_c8 - wVar27,local_c8 + wVar27,feat,flag,
                (_Bool)in_stack_ffffffffffffff08);
    if (flag_00 < wVar26) {
      iVar11 = wVar27 * 2 + -1;
      wVar27 = wVar27 + L'\x01';
      uVar29 = uVar13 + ~(flag_00 * 2);
      do {
        uVar13 = uVar29;
        uVar29 = iVar11 + uVar13;
        uVar4 = -uVar29;
        if (0 < (int)uVar29) {
          uVar4 = uVar29;
        }
        uVar5 = -uVar13;
        if (0 < (int)uVar13) {
          uVar5 = uVar13;
        }
        wVar27 = wVar27 + L'\xffffffff';
        iVar11 = iVar11 + -2;
      } while (uVar4 < uVar5);
    }
  }
  iVar12 = local_c8 - iVar25;
  uVar13 = iVar12 - 2;
  uVar33 = (ulong)uVar13;
  iVar24 = iVar23 + local_c8 + 6;
  if ((int)uVar13 <= iVar24) {
    uVar29 = (iVar11 - iVar25) - 2;
    iVar25 = iVar23 + iVar11 + 6;
    if ((int)uVar29 <= iVar25) {
      iVar19 = (iVar25 - uVar29) + 1;
      p = mem_zalloc((long)(((iVar24 - iVar12) + 3) * iVar19));
      if ((int)uVar13 < 1) {
        uVar33 = 0;
      }
      iVar12 = c->height + L'\xffffffff';
      if (iVar24 <= iVar12) {
        iVar12 = iVar24;
      }
      uVar20 = 0;
      if (0 < (int)uVar29) {
        uVar20 = (ulong)uVar29;
      }
      iVar24 = c->width + L'\xffffffff';
      if (iVar25 <= iVar24) {
        iVar24 = iVar25;
      }
      uVar18 = uVar33;
      do {
        iVar30 = (int)uVar18;
        iVar25 = 1;
        if (1 < iVar30) {
          iVar25 = iVar30;
        }
        if ((long)iVar12 < (long)uVar18) {
          lVar17 = uVar33 << 0x20;
          iVar25 = 0;
          do {
            uVar18 = uVar20;
            iVar30 = iVar25;
            if ((long)iVar12 < (long)uVar33) {
              mem_free(p);
              if ((0 < iVar23) && (uVar8 = Rand_div(4), (int)uVar8 < iVar23)) {
                event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"middle chamber");
                rand_dir(&offset);
                draw_rectangle(c,local_c8 + L'\xfffffffe',iVar11 + L'\xfffffffe',local_c8 + L'\x02',
                               iVar11 + L'\x02',L'\x15',L'\v',false);
                lVar15 = loc(iVar11 + offset.x * 2,local_c8 + offset.y * 2);
                place_closed_door((chunk_conflict *)c,lVar15);
                wVar3 = c->depth;
                wVar27 = Rand_div(2);
                lVar15 = centre_local;
                vault_objects((chunk_conflict *)c,centre_local,wVar3,wVar27);
                wVar3 = c->depth;
                wVar27 = Rand_div(3);
                vault_monsters((chunk_conflict *)c,lVar15,wVar3 + L'\x01',wVar27);
              }
              return true;
            }
            for (; (long)uVar18 <= (long)iVar24; uVar18 = uVar18 + 1) {
              if (*(char *)((long)p + (long)iVar30) == '\x01') {
                lVar2 = (loc)(lVar17 + uVar18);
                _Var6 = square_isfloor((chunk_conflict *)c,lVar2);
                if ((!_Var6) || (_Var6 = square_isroom((chunk_conflict *)c,lVar2), !_Var6)) {
                  __assert_fail("square_isfloor(c, grid) && square_isroom(c, grid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                ,0x209,
                                "void set_bordering_walls(struct chunk *, int, int, int, int)");
                }
                set_marked_granite(c,(loc_conflict)lVar2,L'\f');
              }
              iVar30 = iVar30 + 1;
            }
            uVar33 = uVar33 + 1;
            lVar17 = lVar17 + 0x100000000;
            iVar25 = iVar25 + iVar19;
          } while( true );
        }
        uVar13 = iVar25 - 1;
        iVar25 = c->height + L'\xffffffff';
        uVar1 = uVar18 + 1;
        iVar16 = (int)uVar1;
        if (iVar16 <= iVar25) {
          iVar25 = iVar16;
        }
        lVar17 = uVar18 << 0x20;
        iVar30 = (iVar30 - (int)uVar33) * iVar19 - (int)uVar20;
        uVar28 = uVar20;
        while( true ) {
          iVar14 = (int)uVar28;
          iVar16 = 1;
          if (1 < iVar14) {
            iVar16 = iVar14;
          }
          uVar18 = uVar1;
          if ((long)iVar24 < (long)uVar28) break;
          lVar2 = (loc)(lVar17 + uVar28);
          _Var6 = square_isfloor((chunk_conflict *)c,lVar2);
          if (_Var6) {
            iVar21 = c->width + L'\xffffffff';
            uVar28 = uVar28 + 1;
            if ((int)uVar28 <= iVar21) {
              iVar21 = (int)uVar28;
            }
            _Var6 = square_isroom((chunk_conflict *)c,lVar2);
            if (!_Var6) {
              __assert_fail("square_isroom(c, grid)",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                            ,0x1d5,"void set_bordering_walls(struct chunk *, int, int, int, int)");
            }
            if ((iVar25 - uVar13 == 2) && (iVar21 - (iVar16 - 1U) == 2)) {
              iVar32 = 0;
              lVar31 = (ulong)uVar13 << 0x20;
              for (uVar18 = (ulong)uVar13; uVar22 = (ulong)(iVar16 - 1U),
                  (long)uVar18 <= (long)iVar25; uVar18 = uVar18 + 1) {
                for (; (long)uVar22 <= (long)iVar21; uVar22 = uVar22 + 1) {
                  _Var6 = square_isfloor((chunk_conflict *)c,(loc)(lVar31 + uVar22));
                  _Var7 = square_isroom((chunk_conflict *)c,(loc)(lVar31 + uVar22));
                  if (_Var6 != _Var7) {
                    __assert_fail("floor == square_isroom( c, adj)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                  ,0x1ee,
                                  "void set_bordering_walls(struct chunk *, int, int, int, int)");
                  }
                  iVar32 = iVar32 + (uint)_Var6;
                }
                lVar31 = lVar31 + 0x100000000;
              }
              if (iVar32 != 9) {
                *(undefined1 *)((long)p + (long)(iVar14 + iVar30)) = 1;
              }
            }
            else {
              *(undefined1 *)((long)p + (long)(iVar14 + iVar30)) = 1;
            }
          }
          else {
            _Var6 = square_isroom((chunk_conflict *)c,lVar2);
            if (_Var6) {
              __assert_fail("!square_isroom(c, grid)",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                            ,0x1ff,"void set_bordering_walls(struct chunk *, int, int, int, int)");
            }
            uVar28 = uVar28 + 1;
          }
        }
      } while( true );
    }
  }
  __assert_fail("x2 >= x1 && y2 >= y1",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                ,0x1c2,"void set_bordering_walls(struct chunk *, int, int, int, int)");
}

Assistant:

bool build_circular(struct chunk *c, struct loc centre, int rating)
{
	/* Pick a room size */
	int radius = 2 + randint1(2) + randint1(3);

	/* Occasional light */
	bool light = c->depth <= randint1(25) ? true : false;

	/* Find and reserve lots of space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
		2 * radius + 10, 2 * radius + 10);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, 2 * radius + 10, 2 * radius + 10))
			return (false);
	}

	/* Mark as a room. */
	fill_circle(c, centre.y, centre.x, radius + 1, 0, FEAT_FLOOR,
		SQUARE_NONE, light);

	/* Convert some floors to be the outer walls. */
	set_bordering_walls(c, centre.y - radius - 2, centre.x - radius - 2,
		centre.y + radius + 2, centre.x + radius + 2);

	/* Especially large circular rooms will have a middle chamber */
	if (radius - 4 > 0 && randint0(4) < radius - 4) {
		struct loc offset;

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"middle chamber");

		/* choose a random direction */
		rand_dir(&offset);

		/* draw a room with a closed door on a random side */
		draw_rectangle(c, centre.y - 2, centre.x - 2, centre.y + 2,
			centre.x + 2, FEAT_GRANITE, SQUARE_WALL_INNER, false);
		place_closed_door(c, loc(centre.x + offset.x * 2,
								 centre.y + offset.y * 2));

		/* Place a treasure in the vault */
		vault_objects(c, centre, c->depth, randint0(2));

		/* create some monsterss */
		vault_monsters(c, centre, c->depth + 1, randint0(3));
	}

	return true;
}